

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O2

Point3f pbrt::OffsetRayOrigin(Point3fi pi,Normal3f n,Vector3f w)

{
  float *pfVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  float fVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined8 in_XMM2_Qb;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  Vector3f VVar18;
  Point3f PVar19;
  float local_b4;
  undefined8 local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  Point3<float> local_20;
  
  local_a8 = w.super_Tuple3<pbrt::Vector3,_float>.z;
  local_38 = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._4_60_ = n._12_60_;
  auVar12._0_4_ = n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar9._8_56_ = n._8_56_;
  auVar9._0_8_ = n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  local_98 = auVar9._0_16_;
  local_48 = vmovshdup_avx(local_98);
  local_68 = auVar12._0_16_;
  local_58 = vandps_avx(local_98,auVar17);
  local_78 = vandps_avx(local_48,auVar17);
  local_88 = vandps_avx(local_68,auVar17);
  auVar11 = ZEXT856(local_88._8_8_);
  uStack_30 = in_XMM2_Qb;
  VVar18 = Point3fi::Error(&pi);
  auVar13._4_60_ = auVar12._4_60_;
  auVar13._0_4_ = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  auVar17 = vmovshdup_avx(auVar10._0_16_);
  auVar15 = ZEXT416((uint)(local_88._0_4_ * auVar13._0_4_));
  auVar17 = vfmadd132ss_fma(auVar17,auVar15,ZEXT416((uint)local_78._0_4_));
  auVar15 = vfmsub213ss_fma(auVar13._0_16_,local_88,auVar15);
  auVar4._8_8_ = uStack_30;
  auVar4._0_8_ = local_38;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ + auVar15._0_4_)),auVar10._0_16_,
                            ZEXT416((uint)local_58._0_4_));
  auVar17 = vmovshdup_avx(auVar4);
  auVar8 = ZEXT416((uint)(local_68._0_4_ * local_a8));
  auVar17 = vfmadd132ss_fma(auVar17,auVar8,ZEXT416((uint)local_48._0_4_));
  auVar8 = vfmsub213ss_fma(ZEXT416((uint)local_a8),local_68,auVar8);
  fStack_9c = auVar15._0_4_;
  fVar16 = fStack_9c * local_68._0_4_;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ + auVar8._0_4_)),local_98,auVar4);
  local_a8 = fStack_9c * local_98._0_4_;
  fStack_a4 = fStack_9c * local_98._4_4_;
  fStack_a0 = fStack_9c * local_98._8_4_;
  fStack_9c = fStack_9c * local_98._12_4_;
  uVar2 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x20,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  local_98 = ZEXT416((uint)bVar3 * (int)-fVar16 + (uint)!bVar3 * (int)fVar16);
  if (auVar17._0_4_ < 0.0) {
    local_a8 = -local_a8;
    fStack_a4 = -fStack_a4;
    fStack_a0 = -fStack_a0;
    fStack_9c = -fStack_9c;
  }
  Point3<float>::Point3<pbrt::Interval>(&local_20,&pi.super_Point3<pbrt::Interval>);
  auVar15._4_4_ = fStack_a4;
  auVar15._0_4_ = local_a8;
  auVar15._8_4_ = fStack_a0;
  auVar15._12_4_ = fStack_9c;
  pfVar1 = (float *)((long)&local_b0 + 4);
  iVar5 = 0;
  fVar16 = local_98._0_4_;
  auVar8._0_4_ = local_20.super_Tuple3<pbrt::Point3,_float>.x + local_a8;
  auVar8._4_4_ = local_20.super_Tuple3<pbrt::Point3,_float>.y + fStack_a4;
  auVar8._8_4_ = fStack_a0 + 0.0;
  auVar8._12_4_ = fStack_9c + 0.0;
  local_b4 = fVar16 + local_20.super_Tuple3<pbrt::Point3,_float>.z;
  local_b0 = vmovlps_avx(auVar8);
  auVar17 = vmovshdup_avx(auVar15);
  do {
    fVar14 = local_a8;
    if (((iVar5 != 0) && (fVar14 = auVar17._0_4_, iVar5 != 1)) && (fVar14 = fVar16, iVar5 == 3)) {
      PVar19.super_Tuple3<pbrt::Point3,_float>.z = local_b4;
      PVar19.super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_b0;
      PVar19.super_Tuple3<pbrt::Point3,_float>.y = (float)local_b0._4_4_;
      return (Point3f)PVar19.super_Tuple3<pbrt::Point3,_float>;
    }
    if (fVar14 <= 0.0) {
      fVar14 = local_a8;
      if ((iVar5 != 0) && (fVar14 = auVar17._0_4_, iVar5 != 1)) {
        fVar14 = fVar16;
      }
      if (fVar14 < 0.0) {
        pfVar7 = (float *)&local_b0;
        if ((iVar5 != 0) && (pfVar7 = pfVar1, iVar5 != 1)) {
          pfVar7 = &local_b4;
        }
        fVar14 = *pfVar7;
        fVar6 = -INFINITY;
        if (-INFINITY < fVar14) {
          uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar14),ZEXT816(0) << 0x40,0);
          bVar3 = (bool)((byte)uVar2 & 1);
          fVar14 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar14);
          fVar6 = (float)((int)fVar14 + -1 + (uint)(fVar14 <= 0.0) * 2);
        }
        goto LAB_002fab7d;
      }
    }
    else {
      pfVar7 = (float *)&local_b0;
      if ((iVar5 != 0) && (pfVar7 = pfVar1, iVar5 != 1)) {
        pfVar7 = &local_b4;
      }
      fVar14 = *pfVar7;
      fVar6 = INFINITY;
      if (fVar14 < INFINITY) {
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar14),ZEXT816(0) << 0x40,0);
        fVar14 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar14);
        fVar6 = (float)((-(uint)(fVar14 < 0.0) | 1) + (int)fVar14);
      }
LAB_002fab7d:
      pfVar7 = (float *)&local_b0;
      if ((iVar5 != 0) && (pfVar7 = pfVar1, iVar5 != 1)) {
        pfVar7 = &local_b4;
      }
      *pfVar7 = fVar6;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU inline Point3f OffsetRayOrigin(Point3fi pi, Normal3f n, Vector3f w) {
    // Find vector _offset_ to corner of error bounds and compute initial _po_
    Float d = Dot(Abs(n), pi.Error());
    Vector3f offset = d * Vector3f(n);
    if (Dot(w, n) < 0)
        offset = -offset;
    Point3f po = Point3f(pi) + offset;

    // Round offset point _po_ away from _p_
    for (int i = 0; i < 3; ++i) {
        if (offset[i] > 0)
            po[i] = NextFloatUp(po[i]);
        else if (offset[i] < 0)
            po[i] = NextFloatDown(po[i]);
    }

    return po;
}